

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O3

ObjectPtr __thiscall ICM::DefFunc::System::Type::func(Type *this,DataList *list)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  long in_RDX;
  
  pp_Var2 = (_func_int **)operator_new(0x10);
  uVar1 = *(undefined8 *)**(undefined8 **)(in_RDX + 8);
  *pp_Var2 = (_func_int *)0xe;
  pp_Var2[1] = (_func_int *)0x0;
  p_Var3 = (_func_int *)operator_new(8);
  *(undefined8 *)p_Var3 = uVar1;
  pp_Var2[1] = p_Var3;
  (this->super_FI)._vptr_FuncInitObject = pp_Var2;
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					return ObjectPtr(new Objects::Type(list[0]->type));
				}